

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoopThreadPool::~EventLoopThreadPool(EventLoopThreadPool *this)

{
  EventLoopThreadPool *this_local;
  
  std::vector<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>::~vector
            (&this->m_loops);
  std::
  vector<std::unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>_>_>
  ::~vector(&this->m_threads);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

EventLoopThreadPool::~EventLoopThreadPool()
{
	// Don't delete m_baseLoop, it's stack variable
}